

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::recomputeCapacityThreshold(HighsDomain *this,HighsInt row)

{
  initializer_list<double> __l;
  pointer pHVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  double in_RDI;
  double dVar4;
  value_type vVar5;
  double threshold;
  HighsInt col;
  HighsInt i;
  HighsInt end;
  HighsInt start;
  undefined4 in_stack_ffffffffffffff68;
  HighsInt in_stack_ffffffffffffff6c;
  HighsDomain *this_00;
  double in_stack_ffffffffffffff90;
  value_type lower_bound;
  value_type local_50;
  double local_48;
  double local_40;
  value_type *local_38;
  undefined8 local_30;
  double local_28;
  int local_1c;
  value_type local_18;
  value_type local_14;
  value_type local_10;
  int local_c;
  
  local_c = in_ESI;
  pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5c6366);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&pHVar1->ARstart_,(long)local_c);
  local_10 = *pvVar2;
  pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5c63a1);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&pHVar1->ARstart_,(long)(local_c + 1))
  ;
  local_14 = *pvVar2;
  dVar4 = feastol((HighsDomain *)0x5c63d0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xf0),(long)local_c
                     );
  *pvVar3 = -dVar4;
  for (local_18 = local_10; local_18 < local_14; local_18 = local_18 + 1) {
    pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5c644a);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&pHVar1->ARindex_,(long)local_18);
    local_1c = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 800),
                        (long)local_1c);
    lower_bound = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x308),
                        (long)local_1c);
    if ((lower_bound != *pvVar3) || (NAN(lower_bound) || NAN(*pvVar3))) {
      pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5c64c8);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&pHVar1->ARvalue_,(long)local_18);
      vVar5 = ABS(*pvVar3);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 800),
                          (long)local_1c);
      this_00 = (HighsDomain *)*pvVar3;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x308),(long)local_1c);
      feastol((HighsDomain *)0x5c653e);
      variableType(this_00,in_stack_ffffffffffffff6c);
      local_28 = boundRange(in_RDI,lower_bound,in_stack_ffffffffffffff90,
                            (HighsVarType)((ulong)vVar5 >> 0x38));
      local_28 = vVar5 * local_28;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xf0),
                          (long)local_c);
      local_50 = *pvVar3;
      local_48 = local_28;
      local_40 = feastol((HighsDomain *)0x5c65b8);
      local_38 = &local_50;
      local_30 = 3;
      __l._M_array._4_4_ = in_stack_ffffffffffffff6c;
      __l._M_array._0_4_ = in_stack_ffffffffffffff68;
      __l._M_len = (size_type)this_00;
      in_stack_ffffffffffffff90 = std::max<double>(__l);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xf0),
                          (long)local_c);
      *pvVar3 = in_stack_ffffffffffffff90;
    }
  }
  return;
}

Assistant:

void HighsDomain::recomputeCapacityThreshold(HighsInt row) {
  HighsInt start = mipsolver->mipdata_->ARstart_[row];
  HighsInt end = mipsolver->mipdata_->ARstart_[row + 1];

  capacityThreshold_[row] = -feastol();
  for (HighsInt i = start; i < end; ++i) {
    HighsInt col = mipsolver->mipdata_->ARindex_[i];

    if (col_upper_[col] == col_lower_[col]) continue;

    double threshold = std::fabs(mipsolver->mipdata_->ARvalue_[i]) *
                       boundRange(col_upper_[col], col_lower_[col], feastol(),
                                  variableType(col));

    capacityThreshold_[row] =
        std::max({capacityThreshold_[row], threshold, feastol()});
  }
}